

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O3

unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> __thiscall
wallet::MakeDatabase
          (wallet *this,path *path,DatabaseOptions *options,DatabaseStatus *status,
          bilingual_str *error)

{
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  _Optional_payload_base<wallet::DatabaseFormat> _Var6;
  _Optional_payload_base<wallet::DatabaseFormat> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  long in_FS_OFFSET;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8 [2];
  long *local_b8 [2];
  long local_a8 [6];
  undefined1 local_78 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  args = (_Optional_payload_base<wallet::DatabaseFormat>)status;
  cVar2 = std::filesystem::symlink_status((path *)path);
  if (cVar2 == -1) {
    bVar5 = options->require_existing;
    if ((bool)bVar5 == true) {
      pcVar1 = (path->super_path)._M_pathname._M_dataplus._M_p;
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,pcVar1,pcVar1 + (path->super_path)._M_pathname._M_string_length)
      ;
      tinyformat::format<std::__cxx11::string>
                (&local_118,
                 (tinyformat *)"Failed to load database path \'%s\'. Path does not exist.",
                 (char *)local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + local_118._M_string_length);
      local_78._32_8_ = (_Impl *)&local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_78 + 0x20),local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + local_118._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_78 + 0x20));
      if ((_Impl *)local_78._32_8_ != (_Impl *)&local_48) {
        operator_delete((void *)local_78._32_8_,local_48._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
      *status = FAILED_NOT_FOUND;
    }
    else {
LAB_00c3d351:
      if ((bVar5 & 1) == 0) {
        if ((options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>.
            _M_payload.super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged == true) {
          _Var6 = (options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>
                  ._M_payload.super__Optional_payload_base<wallet::DatabaseFormat>;
          args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ulong)(_Var6._4_4_ & 1);
          goto LAB_00c3d370;
        }
LAB_00c3d3a0:
        MakeSQLiteDatabase((wallet *)local_78,path,options,status,error);
LAB_00c3d3bc:
        *(undefined8 *)this = local_78._0_8_;
        goto LAB_00c3d3c2;
      }
      pcVar1 = (path->super_path)._M_pathname._M_dataplus._M_p;
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,pcVar1,pcVar1 + (path->super_path)._M_pathname._M_string_length)
      ;
      tinyformat::format<std::__cxx11::string>
                (&local_138,
                 (tinyformat *)
                 "Failed to load database path \'%s\'. Data is not in recognized format.",
                 (char *)local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,local_138._M_dataplus._M_p,
                 local_138._M_dataplus._M_p + local_138._M_string_length);
      local_78._32_8_ = (_Impl *)&local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_78 + 0x20),local_138._M_dataplus._M_p,
                 local_138._M_dataplus._M_p + local_138._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_78 + 0x20));
      if ((_Impl *)local_78._32_8_ != (_Impl *)&local_48) {
        operator_delete((void *)local_78._32_8_,local_48._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      local_198.field_2._M_allocated_capacity = local_138.field_2._M_allocated_capacity;
      local_198._M_dataplus._M_p = local_138._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
LAB_00c3d733:
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
LAB_00c3d73b:
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
      *status = FAILED_BAD_FORMAT;
    }
  }
  else {
    BDBDataFile((path *)local_78,path);
    bVar3 = IsBDBFile((path *)local_78);
    std::filesystem::__cxx11::path::~path((path *)local_78);
    SQLiteDataFile((path *)local_78,path);
    bVar4 = IsSQLiteFile((path *)local_78);
    std::filesystem::__cxx11::path::~path((path *)local_78);
    if (bVar4) {
      args._M_payload = (_Storage<wallet::DatabaseFormat,_true>)0x1;
      args._M_engaged = false;
      args._5_3_ = 0;
      if (!bVar3) goto LAB_00c3d1cb;
      pcVar1 = (path->super_path)._M_pathname._M_dataplus._M_p;
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,pcVar1,pcVar1 + (path->super_path)._M_pathname._M_string_length)
      ;
      tinyformat::format<std::__cxx11::string>
                (local_f8,(tinyformat *)
                          "Failed to load database path \'%s\'. Data is in ambiguous format.",
                 (char *)local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,local_f8[0]._M_dataplus._M_p,
                 local_f8[0]._M_dataplus._M_p + local_f8[0]._M_string_length);
      local_78._32_8_ = (_Impl *)&local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_78 + 0x20),local_f8[0]._M_dataplus._M_p,
                 local_f8[0]._M_dataplus._M_p + local_f8[0]._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_78 + 0x20));
      if ((_Impl *)local_78._32_8_ != (_Impl *)&local_48) {
        operator_delete((void *)local_78._32_8_,local_48._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
        operator_delete(local_f8[0]._M_dataplus._M_p,local_f8[0].field_2._M_allocated_capacity + 1);
      }
      if (local_b8[0] != local_a8) {
LAB_00c3d1a4:
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
    }
    else {
      args._M_payload = (_Storage<wallet::DatabaseFormat,_true>)0x0;
      args._M_engaged = false;
      args._5_3_ = 0;
      if (!bVar3) {
        bVar5 = options->require_existing;
        goto LAB_00c3d351;
      }
LAB_00c3d1cb:
      if (options->require_create == true) {
        pcVar1 = (path->super_path)._M_pathname._M_dataplus._M_p;
        local_b8[0] = local_a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,pcVar1,
                   pcVar1 + (path->super_path)._M_pathname._M_string_length);
        tinyformat::format<std::__cxx11::string>
                  (&local_158,
                   (tinyformat *)"Failed to create database path \'%s\'. Database already exists.",
                   (char *)local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        local_78._0_8_ = local_78 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_78,local_158._M_dataplus._M_p,
                   local_158._M_dataplus._M_p + local_158._M_string_length);
        local_78._32_8_ = (_Impl *)&local_48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_78 + 0x20),local_158._M_dataplus._M_p,
                   local_158._M_dataplus._M_p + local_158._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->original,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->translated,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_78 + 0x20));
        if ((_Impl *)local_78._32_8_ != (_Impl *)&local_48) {
          operator_delete((void *)local_78._32_8_,local_48._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
          operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
        *status = FAILED_ALREADY_EXISTS;
        goto LAB_00c3d768;
      }
      bVar5 = (options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>.
              _M_payload.super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged;
      if ((bool)bVar5 != false) {
        args._M_payload = (_Storage<wallet::DatabaseFormat,_true>)0x1;
        args._M_engaged = false;
        args._5_3_ = 0;
      }
      if (bVar4 || (bool)bVar5 != true) {
LAB_00c3d201:
        _Var6 = args;
        bVar5 = (options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>.
                _M_payload.super__Optional_payload_base<wallet::DatabaseFormat>._M_engaged;
      }
      else {
        args._M_payload = (_Storage<wallet::DatabaseFormat,_true>)0x0;
        args._M_engaged = false;
        args._5_3_ = 0;
        _Var6._M_payload = (_Storage<wallet::DatabaseFormat,_true>)0x2;
        _Var6._M_engaged = false;
        _Var6._5_3_ = 0;
        if ((options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>.
            _M_payload.super__Optional_payload_base<wallet::DatabaseFormat>._M_payload._M_value !=
            BERKELEY_RO) goto LAB_00c3d201;
      }
      args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      if (((bVar5 & 1) == 0) ||
         ((bVar5 != 0 &&
          (_Var6._M_payload._M_value ==
           (options->require_format).super__Optional_base<wallet::DatabaseFormat,_true,_true>.
           _M_payload.super__Optional_payload_base<wallet::DatabaseFormat>._M_payload._M_value)))) {
LAB_00c3d370:
        if (((char)args_00 == '\0') || (_Var6._M_payload._M_value == SQLITE)) goto LAB_00c3d3a0;
        if (_Var6._M_payload._M_value != BERKELEY_RO) {
          pcVar1 = (path->super_path)._M_pathname._M_dataplus._M_p;
          local_b8[0] = local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,pcVar1,
                     pcVar1 + (path->super_path)._M_pathname._M_string_length);
          tinyformat::format<std::__cxx11::string>
                    (&local_198,
                     (tinyformat *)
                     "Failed to open database path \'%s\'. Build does not support Berkeley DB database format."
                     ,(char *)local_b8,args_00);
          local_78._0_8_ = local_78 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_78,local_198._M_dataplus._M_p,
                     local_198._M_dataplus._M_p + local_198._M_string_length);
          local_78._32_8_ = (_Impl *)&local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_78 + 0x20),local_198._M_dataplus._M_p,
                     local_198._M_dataplus._M_p + local_198._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&error->original,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&error->translated,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_78 + 0x20));
          if ((_Impl *)local_78._32_8_ != (_Impl *)&local_48) {
            operator_delete((void *)local_78._32_8_,local_48._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
            operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) goto LAB_00c3d733;
          goto LAB_00c3d73b;
        }
        MakeBerkeleyRODatabase
                  ((path *)local_78,(DatabaseOptions *)path,(DatabaseStatus *)options,
                   (bilingual_str *)status);
        goto LAB_00c3d3bc;
      }
      pcVar1 = (path->super_path)._M_pathname._M_dataplus._M_p;
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,pcVar1,pcVar1 + (path->super_path)._M_pathname._M_string_length)
      ;
      tinyformat::format<std::__cxx11::string>
                (&local_178,
                 (tinyformat *)
                 "Failed to load database path \'%s\'. Data is not in required format.",
                 (char *)local_b8,args_00);
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,local_178._M_dataplus._M_p,
                 local_178._M_dataplus._M_p + local_178._M_string_length);
      local_78._32_8_ = (_Impl *)&local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_78 + 0x20),local_178._M_dataplus._M_p,
                 local_178._M_dataplus._M_p + local_178._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_78 + 0x20));
      if ((_Impl *)local_78._32_8_ != (_Impl *)&local_48) {
        operator_delete((void *)local_78._32_8_,local_48._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if (local_b8[0] != local_a8) goto LAB_00c3d1a4;
    }
    *status = FAILED_BAD_FORMAT;
  }
LAB_00c3d768:
  *(undefined8 *)this = 0;
LAB_00c3d3c2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>,_true,_true>
          )(__uniq_ptr_data<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<WalletDatabase> MakeDatabase(const fs::path& path, const DatabaseOptions& options, DatabaseStatus& status, bilingual_str& error)
{
    bool exists;
    try {
        exists = fs::symlink_status(path).type() != fs::file_type::not_found;
    } catch (const fs::filesystem_error& e) {
        error = Untranslated(strprintf("Failed to access database path '%s': %s", fs::PathToString(path), fsbridge::get_filesystem_error_message(e)));
        status = DatabaseStatus::FAILED_BAD_PATH;
        return nullptr;
    }

    std::optional<DatabaseFormat> format;
    if (exists) {
        if (IsBDBFile(BDBDataFile(path))) {
            format = DatabaseFormat::BERKELEY;
        }
        if (IsSQLiteFile(SQLiteDataFile(path))) {
            if (format) {
                error = Untranslated(strprintf("Failed to load database path '%s'. Data is in ambiguous format.", fs::PathToString(path)));
                status = DatabaseStatus::FAILED_BAD_FORMAT;
                return nullptr;
            }
            format = DatabaseFormat::SQLITE;
        }
    } else if (options.require_existing) {
        error = Untranslated(strprintf("Failed to load database path '%s'. Path does not exist.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_NOT_FOUND;
        return nullptr;
    }

    if (!format && options.require_existing) {
        error = Untranslated(strprintf("Failed to load database path '%s'. Data is not in recognized format.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_BAD_FORMAT;
        return nullptr;
    }

    if (format && options.require_create) {
        error = Untranslated(strprintf("Failed to create database path '%s'. Database already exists.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_ALREADY_EXISTS;
        return nullptr;
    }

    // If BERKELEY was the format, then change the format from BERKELEY to BERKELEY_RO
    if (format && options.require_format && format == DatabaseFormat::BERKELEY && options.require_format == DatabaseFormat::BERKELEY_RO) {
        format = DatabaseFormat::BERKELEY_RO;
    }

    // A db already exists so format is set, but options also specifies the format, so make sure they agree
    if (format && options.require_format && format != options.require_format) {
        error = Untranslated(strprintf("Failed to load database path '%s'. Data is not in required format.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_BAD_FORMAT;
        return nullptr;
    }

    // Format is not set when a db doesn't already exist, so use the format specified by the options if it is set.
    if (!format && options.require_format) format = options.require_format;

    // If the format is not specified or detected, choose the default format based on what is available. We prefer BDB over SQLite for now.
    if (!format) {
#ifdef USE_SQLITE
        format = DatabaseFormat::SQLITE;
#endif
#ifdef USE_BDB
        format = DatabaseFormat::BERKELEY;
#endif
    }

    if (format == DatabaseFormat::SQLITE) {
#ifdef USE_SQLITE
        if constexpr (true) {
            return MakeSQLiteDatabase(path, options, status, error);
        } else
#endif
        {
            error = Untranslated(strprintf("Failed to open database path '%s'. Build does not support SQLite database format.", fs::PathToString(path)));
            status = DatabaseStatus::FAILED_BAD_FORMAT;
            return nullptr;
        }
    }

    if (format == DatabaseFormat::BERKELEY_RO) {
        return MakeBerkeleyRODatabase(path, options, status, error);
    }

#ifdef USE_BDB
    if constexpr (true) {
        return MakeBerkeleyDatabase(path, options, status, error);
    } else
#endif
    {
        error = Untranslated(strprintf("Failed to open database path '%s'. Build does not support Berkeley DB database format.", fs::PathToString(path)));
        status = DatabaseStatus::FAILED_BAD_FORMAT;
        return nullptr;
    }
}